

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cc
# Opt level: O0

void __thiscall fasttext::Vector::addRow(Vector *this,Matrix *A,int64_t i)

{
  int64_t iVar1;
  int64_t iVar2;
  Matrix *in_RDX;
  long *in_RSI;
  undefined8 in_RDI;
  int64_t in_stack_ffffffffffffffd0;
  Matrix *this_00;
  
  if ((long)in_RDX < 0) {
    __assert_fail("i >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/asd5510[P]fastText-chinese-word2vec-optimization/src/vector.cc"
                  ,0x3e,"void fasttext::Vector::addRow(const Matrix &, int64_t)");
  }
  this_00 = in_RDX;
  iVar1 = Matrix::size(in_RDX,in_stack_ffffffffffffffd0);
  if ((long)this_00 < iVar1) {
    iVar1 = size((Vector *)0x1b4096);
    iVar2 = Matrix::size(this_00,iVar1);
    if (iVar1 == iVar2) {
      (**(code **)(*in_RSI + 0x20))(in_RSI,in_RDI,(ulong)in_RDX & 0xffffffff);
      return;
    }
    __assert_fail("size() == A.size(1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/asd5510[P]fastText-chinese-word2vec-optimization/src/vector.cc"
                  ,0x40,"void fasttext::Vector::addRow(const Matrix &, int64_t)");
  }
  __assert_fail("i < A.size(0)",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/asd5510[P]fastText-chinese-word2vec-optimization/src/vector.cc"
                ,0x3f,"void fasttext::Vector::addRow(const Matrix &, int64_t)");
}

Assistant:

void Vector::addRow(const Matrix& A, int64_t i) {
  assert(i >= 0);
  assert(i < A.size(0));
  assert(size() == A.size(1));
  A.addRowToVector(*this, i);
}